

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O1

bool google::glog_internal_namespace_::SafeFNMatch_
               (char *pattern,size_t patt_len,char *str,size_t str_len)

{
  ulong uVar1;
  char cVar2;
  char *str_00;
  size_t str_len_00;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  
  bVar4 = str_len == 0;
  bVar5 = patt_len == 0;
  if (!bVar5) {
    uVar1 = patt_len - 1;
    sVar3 = 0;
    do {
      if (bVar4) {
        if (uVar1 != sVar3) {
          return false;
        }
        return pattern[sVar3] == '*';
      }
      cVar2 = pattern[sVar3];
      if ((cVar2 != '?') && (cVar2 != str[sVar3])) {
        if (cVar2 != '*') {
          return false;
        }
        if (uVar1 != sVar3) {
          str_00 = str + sVar3;
          str_len_00 = str_len - sVar3;
          do {
            bVar4 = SafeFNMatch_(pattern + sVar3 + 1,~sVar3 + patt_len,str_00,str_len_00);
            if (bVar4) {
              return bVar4;
            }
            str_00 = str_00 + 1;
            bVar5 = str_len_00 != 1;
            str_len_00 = str_len_00 - 1;
          } while (bVar5);
          return bVar4;
        }
        return true;
      }
      bVar5 = uVar1 == sVar3;
      bVar4 = str_len - 1 == sVar3;
      sVar3 = sVar3 + 1;
    } while (patt_len != sVar3);
  }
  return (bool)(bVar4 & bVar5);
}

Assistant:

GLOG_NO_EXPORT bool SafeFNMatch_(const char* pattern, size_t patt_len,
                                 const char* str, size_t str_len) {
  size_t p = 0;
  size_t s = 0;
  while (true) {
    if (p == patt_len && s == str_len) return true;
    if (p == patt_len) return false;
    if (s == str_len) return p + 1 == patt_len && pattern[p] == '*';
    if (pattern[p] == str[s] || pattern[p] == '?') {
      p += 1;
      s += 1;
      continue;
    }
    if (pattern[p] == '*') {
      if (p + 1 == patt_len) return true;
      do {
        if (SafeFNMatch_(pattern + (p + 1), patt_len - (p + 1), str + s,
                         str_len - s)) {
          return true;
        }
        s += 1;
      } while (s != str_len);
      return false;
    }
    return false;
  }
}